

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Transmitter_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Transmitter_PDU::Transmitter_PDU
          (Transmitter_PDU *this,RadioEntityType *Type,TransmitState TS,RadioInputSource IS,
          AntennaLocation *AL,AntennaPatternType APT,KUINT64 Freq,KFLOAT32 FreqBW,KFLOAT32 Power,
          ModulationType *MT,CryptoSystem *CS,KOCTET *ModulationParams,KUINT8 ModulationParamsLength
          ,KOCTET *AntennaPattern,KUINT16 AntennaPatternLength)

{
  KFLOAT32 Power_local;
  KFLOAT32 FreqBW_local;
  AntennaPatternType APT_local;
  AntennaLocation *AL_local;
  RadioInputSource IS_local;
  TransmitState TS_local;
  RadioEntityType *Type_local;
  Transmitter_PDU *this_local;
  
  Radio_Communications_Header::Radio_Communications_Header(&this->super_Radio_Communications_Header)
  ;
  (this->super_Radio_Communications_Header).super_Header.super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Transmitter_PDU_0032bab0;
  DATA_TYPE::RadioEntityType::RadioEntityType(&this->m_RadioEntityType,Type);
  this->m_ui8TransmitterState = (KUINT8)TS;
  this->m_ui8InputSource = (KUINT8)IS;
  this->m_ui16Padding1 = 0;
  DATA_TYPE::AntennaLocation::AntennaLocation(&this->m_AntennaLocation,AL);
  this->m_ui16AntennaPatternType = (KUINT16)APT;
  this->m_ui16AntennaPatternLength = 0;
  this->m_ui64Freq = Freq;
  this->m_f32TransmitFreqBW = FreqBW;
  this->m_f32Power = Power;
  DATA_TYPE::ModulationType::ModulationType(&this->m_ModulationType,MT);
  DATA_TYPE::CryptoSystem::CryptoSystem(&this->m_CryptoSystem,CS);
  this->m_ui8LengthOfModulationParam = '\0';
  this->m_ui16Padding2 = 0;
  this->m_ui8Padding3 = '\0';
  std::vector<char,_std::allocator<char>_>::vector(&this->m_vModulationParams);
  std::vector<char,_std::allocator<char>_>::vector(&this->m_vAntennaPattern);
  (this->super_Radio_Communications_Header).super_Header.super_Header6.m_ui8PDUType = '\x19';
  (this->super_Radio_Communications_Header).super_Header.super_Header6.m_ui16PDULength = 0x68;
  return;
}

Assistant:

Transmitter_PDU::Transmitter_PDU( const RadioEntityType & Type, TransmitState TS, RadioInputSource IS,
                                  const AntennaLocation & AL, AntennaPatternType APT, KUINT64 Freq,
                                  KFLOAT32 FreqBW, KFLOAT32 Power, const ModulationType & MT,
                                  const CryptoSystem & CS, const KOCTET * ModulationParams,
                                  KUINT8 ModulationParamsLength, const KOCTET * AntennaPattern,
                                  KUINT16 AntennaPatternLength ) :
    m_RadioEntityType( Type ),
    m_ui8TransmitterState( TS ),
    m_ui8InputSource( IS ),
    m_ui16Padding1( 0 ),
    m_AntennaLocation( AL ),
    m_ui16AntennaPatternType( APT ),
    m_ui16AntennaPatternLength( 0 ),
    m_ui64Freq( Freq ),
    m_f32TransmitFreqBW( FreqBW ),
    m_f32Power( Power ),
    m_ModulationType( MT ),
    m_CryptoSystem( CS ),
    m_ui8LengthOfModulationParam( 0 ),
    m_ui16Padding2( 0 ),
    m_ui8Padding3( 0 )
{
    m_ui8PDUType = Transmitter_PDU_Type;
    m_ui16PDULength = TRANSMITTER_PDU_SIZE;
}